

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.hh
# Opt level: O3

void __thiscall
tchecker::pool_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_>::
destruct_all(pool_t<tchecker::make_shared_t<tchecker::zg::transition_t,_unsigned_long,_1UL>_> *this)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  long *plVar4;
  long *plVar5;
  
  plVar5 = (long *)this->_block_head;
  if (plVar5 != (long *)0x0) {
    do {
      sVar1 = this->_block_size;
      if (sVar1 != 8) {
        plVar4 = plVar5 + 1;
        do {
          if ((this->_raw_head <= plVar4) && (plVar4 < this->_raw_end)) break;
          if (*plVar4 != -1) {
            if (*plVar4 != 0) {
              __assert_fail("*refcount == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/pool.hh"
                            ,0x10b,
                            "void tchecker::pool_t<tchecker::make_shared_t<tchecker::zg::transition_t>>::destruct_all() [T = tchecker::make_shared_t<tchecker::zg::transition_t>]"
                           );
            }
            *plVar4 = -1;
            ta::transition_t::~transition_t((transition_t *)(plVar4 + 1));
          }
          plVar4 = (long *)((long)plVar4 + this->_alloc_size);
        } while (plVar4 != (long *)(sVar1 + (long)plVar5));
      }
      plVar5 = (long *)*plVar5;
    } while (plVar5 != (long *)0x0);
    pcVar3 = this->_block_head;
    while (pcVar3 != (char *)0x0) {
      pcVar2 = *(char **)pcVar3;
      operator_delete__(pcVar3);
      pcVar3 = pcVar2;
    }
  }
  this->_block_head = (char *)0x0;
  this->_raw_head = (char *)0x0;
  this->_blocks_count = 0;
  this->_free_head = (char *)0x0;
  this->_raw_end = (char *)0x0;
  return;
}

Assistant:

void destruct_all()
  {
    // Call destructor on all chunks in blocks list that
    // - are not in free list
    // - are not in raw block
    for (void * block = _block_head; block != nullptr; block = nextblock(block)) {
      void * block_end = static_cast<char *>(block) + _block_size;

      for (char * chunk = first_chunk_ptr(block); chunk != block_end; chunk += _alloc_size) {
        // Ignore chunks inside unused raw block
        if ((_raw_head <= chunk) && (chunk < _raw_end))
          break;

        // Destruct all chunks that are not free
        typename T::refcount_t * refcount = reinterpret_cast<typename T::refcount_t *>(chunk);

        if (*refcount > T::REFCOUNT_MAX)
          continue;

        assert(*refcount == 0);
        // make the chunk free using its refcount
        *refcount = FREE_CHUNK;
        // destruct the object in the chunk
        T * t = reinterpret_cast<T *>(refcount + 1);
        T::destruct(t); // t->~T();
      }
    }

    // Free memory
    free_all();
  }